

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall
fmt::internal::PrintfArgFormatter<char>::visit_char(PrintfArgFormatter<char> *this,int value)

{
  BasicWriter<char> *this_00;
  FormatSpec *pFVar1;
  Buffer<char> *pBVar2;
  size_t sVar3;
  uint uVar4;
  Buffer<char> *pBVar5;
  size_t __len;
  ulong uVar6;
  char *__s;
  
  this_00 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>).writer_;
  pFVar1 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>).spec_;
  if ((pFVar1->type_ != '\0') && (pFVar1->type_ != 'c')) {
    BasicWriter<char>::write_int<int,fmt::FormatSpec>(this_00,value,*pFVar1);
  }
  uVar6 = (ulong)(pFVar1->super_AlignSpec).super_WidthSpec.width_;
  if (uVar6 < 2) {
    pBVar2 = this_00->buffer_;
    sVar3 = pBVar2->size_;
    uVar6 = sVar3 + 1;
    pBVar5 = pBVar2;
    if (pBVar2->capacity_ < uVar6) {
      (**pBVar2->_vptr_Buffer)(pBVar2,uVar6);
      pBVar5 = this_00->buffer_;
    }
    pBVar2->size_ = uVar6;
    __s = pBVar5->ptr_ + sVar3;
  }
  else {
    pBVar2 = this_00->buffer_;
    sVar3 = pBVar2->size_;
    uVar6 = uVar6 + sVar3;
    pBVar5 = pBVar2;
    if (pBVar2->capacity_ < uVar6) {
      (**pBVar2->_vptr_Buffer)(pBVar2,uVar6);
      pBVar5 = this_00->buffer_;
    }
    pBVar2->size_ = uVar6;
    uVar4 = (pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1;
    __s = pBVar5->ptr_ + sVar3;
    if ((pFVar1->super_AlignSpec).align_ == ALIGN_LEFT) {
      if (uVar4 != 0) {
        memset(__s + 1,0x20,(ulong)uVar4);
      }
    }
    else {
      if (uVar4 == 0) {
        uVar4 = 0;
      }
      else {
        memset(__s,0x20,(ulong)uVar4);
        uVar4 = (pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1;
      }
      __s = __s + uVar4;
    }
  }
  *__s = (char)value;
  return;
}

Assistant:

void visit_char(int value) {
    const FormatSpec &fmt_spec = this->spec();
    BasicWriter<Char> &w = this->writer();
    if (fmt_spec.type_ && fmt_spec.type_ != 'c')
      w.write_int(value, fmt_spec);
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    CharPtr out = CharPtr();
    if (fmt_spec.width_ > 1) {
      Char fill = ' ';
      out = w.grow_buffer(fmt_spec.width_);
      if (fmt_spec.align_ != ALIGN_LEFT) {
        std::fill_n(out, fmt_spec.width_ - 1, fill);
        out += fmt_spec.width_ - 1;
      } else {
        std::fill_n(out + 1, fmt_spec.width_ - 1, fill);
      }
    } else {
      out = w.grow_buffer(1);
    }
    *out = static_cast<Char>(value);
  }